

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

lua_State * luaL_newstate(void)

{
  undefined8 uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int *piVar8;
  void *pvVar9;
  long lVar10;
  lua_State *L;
  long lVar11;
  ulong uVar12;
  TValue *__s;
  long lVar13;
  undefined1 auVar14 [16];
  ushort uVar15;
  int iVar16;
  
  piVar8 = __errno_location();
  iVar7 = *piVar8;
  pvVar9 = mmap64((void *)0x0,0x20000,3,0x62,-1,0);
  *piVar8 = iVar7;
  if (pvVar9 != (void *)0xffffffffffffffff) {
    uVar12 = (ulong)(-(int)pvVar9 - 0x10U & 7);
    lVar13 = (long)pvVar9 + uVar12;
    __s = (TValue *)((long)pvVar9 + uVar12 + 0x10);
    memset(__s,0,0x368);
    *(undefined8 *)((long)pvVar9 + uVar12 + 8) = 0x36b;
    *(void **)((long)pvVar9 + uVar12 + 0x358) = pvVar9;
    *(undefined8 *)((long)pvVar9 + uVar12 + 0x360) = 0x20000;
    *(undefined8 *)((long)pvVar9 + uVar12 + 0x40) = 0xff;
    lVar10 = (long)pvVar9 + uVar12 + 0x48;
    lVar11 = 0x20;
    do {
      *(long *)(lVar10 + 0x18) = lVar10;
      *(long *)(lVar10 + 0x10) = lVar10;
      lVar10 = lVar10 + 0x10;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    uVar12 = (ulong)(-(int)lVar13 - 0x378U & 7);
    lVar10 = lVar13 + uVar12;
    uVar12 = (long)pvVar9 + (-uVar12 - (lVar13 + 0x368)) + 0x1ffc0;
    *(long *)(lVar13 + 0x30) = lVar10 + 0x368;
    *(ulong *)(lVar13 + 0x20) = uVar12;
    *(ulong *)(lVar10 + 0x370) = uVar12 | 1;
    *(undefined8 *)((long)pvVar9 + 0x1ffc8) = 0x40;
    *(undefined8 *)(lVar13 + 0x38) = 0x200000;
    L = (lua_State *)lj_alloc_malloc(__s,0x1470);
    if ((ulong)L >> 0x20 == 0 && L != (lua_State *)0x0) {
      lVar13 = 0;
      memset(L,0,0x1470);
      L->marked = 'a';
      L->gct = '\x06';
      L->dummy_ffid = '\x01';
      (L->glref).ptr32 = (uint32_t)(L + 1);
      *(undefined1 *)&L[1].openupval.gcptr32 = 0x21;
      L[3].marked = '\x01';
      L[3].gct = '\x04';
      L[1].base = (TValue *)lj_alloc_f;
      L[1].top = __s;
      iVar7 = (int)L;
      *(int *)((long)&L[3].base + 4) = iVar7;
      L[3].stacksize = iVar7 + 0xf0U;
      *(MSize *)&L[3].field_0x3c = iVar7 + 0xf0U;
      L[1].glref.ptr32 = 0xffffffff;
      *(undefined4 *)(((ulong)(L + 1) & 0xffffffff) + 0x9c) = 0xffffffff;
      L[2].env.gcptr32 = 0xffffffff;
      *(undefined4 *)((long)&L[2].cframe + 4) = 0xffffffff;
      *(int *)&L[2].field_0x3c = iVar7 + 0xa8;
      L[2].top = (TValue *)0x0;
      L[2].stack.ptr32 = 0;
      *(undefined1 *)((long)&L[1].openupval.gcptr32 + 1) = 0;
      *(int *)&L[1].cframe = iVar7;
      *(int *)((long)&L[1].cframe + 4) = iVar7 + 0x70;
      L[1].maxstack.ptr32 = 0x1470;
      *(undefined4 *)((long)&L[2].base + 4) = 200;
      L[2].glref.ptr32 = 200;
      do {
        uVar15 = *(ushort *)((long)lj_bc_ofs + lVar13);
        *(code **)(&L[0x2f].stacksize + lVar13) = lj_BC_ISLT + uVar15;
        *(code **)((long)&L[0x43].base + lVar13 * 4) = lj_BC_ISLT + uVar15;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 0xaa);
      lVar13 = 0;
      do {
        uVar15 = (ushort)((uint)*(undefined4 *)(lj_bc_ofs + lVar13 + 0x55) >> 0x10);
        *(code **)(&L[0x3a].maxstack + lVar13 * 2) =
             lj_BC_ISLT +
             ((ulong)CONCAT24(uVar15,*(undefined4 *)(lj_bc_ofs + lVar13 + 0x55)) & 0xffff);
        *(code **)(&L[0x3a].maxstack + lVar13 * 2 + 2) = lj_BC_ISLT + uVar15;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 0x46);
      L[0x39].base = L[0x39].top;
      *(void **)&L[0x39].openupval = L[0x39].cframe;
      uVar1._0_4_ = L[0x3a].glref;
      uVar1._4_4_ = L[0x3a].gclist;
      L[0x3a].nextgc = (GCRef)(undefined4)uVar1;
      L[0x3a].marked = (char)((ulong)uVar1 >> 0x20);
      L[0x3a].gct = (char)((ulong)uVar1 >> 0x28);
      L[0x3a].dummy_ffid = (char)((ulong)uVar1 >> 0x30);
      L[0x3a].status = (char)((ulong)uVar1 >> 0x38);
      L[0x3a].maxstack = (MRef)L[0x3a].openupval.gcptr32;
      L[0x3a].stack = (MRef)L[0x3a].env.gcptr32;
      uVar2 = L[0x3b].marked;
      uVar3 = L[0x3b].gct;
      uVar4 = L[0x3b].dummy_ffid;
      uVar5 = L[0x3b].status;
      L[0x3a].stacksize = L[0x3b].nextgc.gcptr32;
      L[0x3a].field_0x3c = uVar2;
      L[0x3a].field_0x3d = uVar3;
      L[0x3a].field_0x3e = uVar4;
      L[0x3a].field_0x3f = uVar5;
      *(undefined8 *)&L[4].env = 0x145b0000145b;
      auVar6 = _DAT_00155f00;
      lVar13 = 0x4df;
      iVar7 = (int)DAT_00155f40;
      iVar16 = DAT_00155f40._4_4_;
      auVar14 = _DAT_00155ef0;
      do {
        if (SUB164(auVar14 ^ auVar6,4) == iVar16 && SUB164(auVar14 ^ auVar6,0) < iVar7) {
          *(int *)((long)L + lVar13 * 4 + -4) = (int)lVar13 + -0x482;
          (&L->nextgc)[lVar13].gcptr32 = (int)lVar13 - 0x481;
        }
        lVar10 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar10 + 2;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 0x51d);
      L->status = '\x06';
      iVar7 = lj_vm_cpcall(L,0,0,cpluaopen);
      if (iVar7 == 0) {
        L->status = '\0';
        *(code **)((ulong)(L->glref).ptr32 + 0xe0) = panic;
        return L;
      }
      close_state(L);
    }
  }
  return (lua_State *)0x0;
}

Assistant:

LUALIB_API lua_State *luaL_newstate(void)
{
  lua_State *L;
  void *ud = lj_alloc_create();
  if (ud == NULL) return NULL;
#if LJ_64
  L = lj_state_newstate(lj_alloc_f, ud);
#else
  L = lua_newstate(lj_alloc_f, ud);
#endif
  if (L) G(L)->panic = panic;
  return L;
}